

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int end_get_error(END_HANDLE end,ERROR_HANDLE *error_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  END_INSTANCE *end_instance;
  uint32_t item_count;
  int result;
  ERROR_HANDLE *error_value_local;
  END_HANDLE end_local;
  
  if (end == (END_HANDLE)0x0) {
    end_instance._4_4_ = 0x2633;
  }
  else {
    _item_count = error_value;
    error_value_local = (ERROR_HANDLE *)end;
    iVar1 = amqpvalue_get_composite_item_count(end->composite_value,(uint32_t *)&end_instance);
    if (iVar1 == 0) {
      if ((int)end_instance == 0) {
        end_instance._4_4_ = 0x2641;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(end->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          end_instance._4_4_ = 0x2649;
        }
        else {
          iVar1 = amqpvalue_get_error(value,_item_count);
          if (iVar1 == 0) {
            end_instance._4_4_ = 0;
          }
          else {
            end_instance._4_4_ = 0x2650;
          }
        }
      }
    }
    else {
      end_instance._4_4_ = 0x263b;
    }
  }
  return end_instance._4_4_;
}

Assistant:

int end_get_error(END_HANDLE end, ERROR_HANDLE* error_value)
{
    int result;

    if (end == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        END_INSTANCE* end_instance = (END_INSTANCE*)end;
        if (amqpvalue_get_composite_item_count(end_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(end_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_error(item_value, error_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}